

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_main.c
# Opt level: O2

err_t cmdInit(void)

{
  err_t eVar1;
  
  eVar1 = verInit();
  if (eVar1 == 0) {
    eVar1 = bsumInit();
    if (eVar1 == 0) {
      eVar1 = pwdInit();
      if (eVar1 == 0) {
        eVar1 = kgInit();
        if (eVar1 == 0) {
          eVar1 = cvcInit();
          if (eVar1 == 0) {
            eVar1 = cvrInit();
            if (eVar1 == 0) {
              eVar1 = sigInit();
              if (eVar1 == 0) {
                eVar1 = csrInit();
                if (eVar1 == 0) {
                  eVar1 = stampInit();
                  if (eVar1 == 0) {
                    eVar1 = esInit();
                    if (eVar1 == 0) {
                      eVar1 = stInit();
                      if (eVar1 == 0) {
                        eVar1 = affixInit();
                        return eVar1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return eVar1;
}

Assistant:

err_t cmdInit()
{
	err_t code;
	code = verInit();
	ERR_CALL_CHECK(code);
	code = bsumInit();
	ERR_CALL_CHECK(code);
	code = pwdInit();
	ERR_CALL_CHECK(code);
	code = kgInit();
	ERR_CALL_CHECK(code);
	code = cvcInit();
	ERR_CALL_CHECK(code);
	code = cvrInit();
	ERR_CALL_CHECK(code);
	code = sigInit();
	ERR_CALL_CHECK(code);
	code = csrInit();
	ERR_CALL_CHECK(code);
	code = stampInit();
	ERR_CALL_CHECK(code);
	code = esInit();
	ERR_CALL_CHECK(code);
	code = stInit();
	ERR_CALL_CHECK(code);
	code = affixInit();
	ERR_CALL_CHECK(code);
	return code;
}